

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O2

bool libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::tle_hard>
               (path *input_file_path)

{
  int iVar1;
  undefined8 local_a0;
  time_point start;
  usize time_ms;
  path local_88;
  path solution_out_path;
  path local_38;
  
  if (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::input_file ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                 ::input_file);
    if (iVar1 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 input_file);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                   input_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                           ::input_file);
    }
  }
  if (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
      generated_output_file == '\0') {
    iVar1 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                 ::generated_output_file);
    if (iVar1 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                   generated_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                           ::generated_output_file);
    }
  }
  if (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
      solution_output_file_in == '\0') {
    iVar1 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file_in);
    if (iVar1 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file_in,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                           ::solution_output_file_in);
    }
  }
  if (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
      solution_output_file == '\0') {
    iVar1 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file);
    if (iVar1 != 0) {
      std::ofstream::ofstream
                (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file);
      __cxa_atexit(std::ofstream::~ofstream,
                   check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                           ::solution_output_file);
    }
  }
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ RUN      ] ");
  std::filesystem::__cxx11::path::filename(&local_38,input_file_path);
  cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  std::filesystem::__cxx11::path::path(&solution_out_path,input_file_path);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_88,(char (*) [5])".txt",auto_format);
  std::filesystem::__cxx11::path::replace_extension(&solution_out_path);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
             input_file,input_file_path,_S_in);
  std::ofstream::open(check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                      ::solution_output_file,
                      (_Ios_Openmode)solution_out_path._M_pathname._M_dataplus._M_p);
  time_ms = 200;
  start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_a0 = 0;
  local_88._M_pathname._M_dataplus._M_p = (pointer)operator_new(0x18);
  *(undefined ***)local_88._M_pathname._M_dataplus._M_p = &PTR___State_0010dd70;
  *(usize **)((long)local_88._M_pathname._M_dataplus._M_p + 8) = &time_ms;
  *(time_point **)((long)local_88._M_pathname._M_dataplus._M_p + 0x10) = &start;
  std::thread::_M_start_thread(&local_a0,&local_88,0);
  if ((long *)local_88._M_pathname._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_88._M_pathname._M_dataplus._M_p + 8))();
  }
  do {
  } while( true );
}

Assistant:

static bool check(const fs::path& input_file_path)
    {
        static std::ifstream input_file, generated_output_file, solution_output_file_in;
        static std::ofstream solution_output_file;
        cprintf(ac_color, "[ RUN      ] "), cprintln(message_color, input_file_path.filename());
        auto solution_out_path = input_file_path;
        solution_out_path.replace_extension(".txt");
        input_file.open(input_file_path), solution_output_file.open(solution_out_path);
        const usize time_ms = run([&]() { Solution::solve(input_file, solution_output_file); });
        input_file.close(), solution_output_file.close();
        bool passed = false;
        if (time_ms >= Problem::time_limit) {
            cprintf(tle_color, "[      TLE ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
        } else {
            auto generated_out_path = input_file_path;
            generated_out_path.replace_extension(".out");
            if (fs::exists(generated_out_path)) {
                input_file.open(input_file_path), generated_output_file.open(generated_out_path), solution_output_file_in.open(solution_out_path);
                const bool ok = Problem::judge(input_file, generated_output_file, solution_output_file_in);
                if (not ok) {
                    cprintf(wa_color, "[       WA ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    std::ifstream in_file{input_file_path}, gen_file{generated_out_path}, sol_file{solution_out_path};
                    std::string line;
                    cprintln(message_color, "(Input)");
                    while (std::getline(in_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Expected)");
                    while (std::getline(gen_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Output)");
                    while (std::getline(sol_file, line)) { cprintln(message_color, line); }
                } else {
                    cprintf(ac_color, "[       AC ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    passed = true;
                }
                solution_output_file_in.close();
            } else {
                cprintf(ac_color, "[       OK ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                passed = true;
            }
        }
        generated_output_file.close(), input_file.close(), solution_output_file.close();
        return passed;
    }